

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O2

void push0_sock_init(void *arg,nni_sock *sock)

{
  nni_mtx_init((nni_mtx *)((long)arg + 0x88));
  nni_aio_list_init((nni_list *)((long)arg + 0x48));
  nni_list_init_offset((nni_list *)((long)arg + 0x60),0x10);
  nni_lmq_init((nni_lmq *)arg,0);
  nni_pollable_init((nni_pollable *)((long)arg + 0x78));
  return;
}

Assistant:

static void
push0_sock_init(void *arg, nni_sock *sock)
{
	push0_sock *s = arg;
	NNI_ARG_UNUSED(sock);

	nni_mtx_init(&s->m);
	nni_aio_list_init(&s->aq);
	NNI_LIST_INIT(&s->pl, push0_pipe, node);
	nni_lmq_init(&s->wq, 0); // initially we start unbuffered.
	nni_pollable_init(&s->writable);
}